

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

TCGLabel * gen_new_label_aarch64(TCGContext_conflict1 *s)

{
  uint uVar1;
  TCGLabel *__s;
  TCGLabel *l;
  TCGContext_conflict1 *s_local;
  
  __s = (TCGLabel *)tcg_malloc(s,0x28);
  memset(__s,0,0x28);
  uVar1 = s->nb_labels;
  s->nb_labels = uVar1 + 1;
  *(uint *)__s = *(uint *)__s & 0xffff0003 | (uVar1 & 0x3fff) << 2;
  (__s->relocs).sqh_first = (TCGRelocation *)0x0;
  (__s->relocs).sqh_last = &(__s->relocs).sqh_first;
  (__s->next).sqe_next = (TCGLabel *)0x0;
  *(s->labels).sqh_last = __s;
  (s->labels).sqh_last = &(__s->next).sqe_next;
  return __s;
}

Assistant:

TCGLabel *gen_new_label(TCGContext *s)
{
    TCGLabel *l = tcg_malloc(s, sizeof(TCGLabel));

    memset(l, 0, sizeof(TCGLabel));
    l->id = s->nb_labels++;
    QSIMPLEQ_INIT(&l->relocs);

    QSIMPLEQ_INSERT_TAIL(&s->labels, l, next);

    return l;
}